

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

result_type
time_plain<boost::random::shuffle_order_engine<boost::random::linear_congruential_engine<unsigned_int,1366u,150889u,714025u>,97ul>>
          (shuffle_order_engine<boost::random::linear_congruential_engine<unsigned_int,_1366U,_150889U,_714025U>,_97UL>
           *r)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  result_type rVar5;
  long lVar6;
  string res;
  string local_40;
  double local_20;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  uVar3 = (r->_rng)._x;
  uVar1 = r->y;
  rVar5 = 0;
  lVar6 = 0x1000000;
  do {
    uVar4 = ((ulong)uVar1 * 0x61) / 0xae529;
    r->y = r->v[uVar4];
    uVar3 = (uVar3 * 0x556 + 0x24d69) % 0xae529;
    r->v[uVar4] = uVar3;
    uVar1 = r->y;
    rVar5 = rVar5 + uVar1;
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  (r->_rng)._x = uVar3;
  lVar6 = std::chrono::_V2::system_clock::now();
  local_20 = 16.777216 / ((double)((lVar6 - lVar2) / 1000) * 1e-06);
  to_string<double>(&local_40,&local_20);
  while (local_40._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_40);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return rVar5;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}